

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_iter.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_22652::
ARTIteratorTest_emptyTreeSeek_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTIteratorTest_emptyTreeSeek_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  pointer *ppaVar1;
  char *in_R9;
  undefined1 local_2d0 [8];
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  iterator e;
  AssertionResult gtest_ar_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  AssertHelper local_28;
  bool local_19 [8];
  bool match;
  
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                   *)local_2d0,false);
  ppaVar1 = &verifier.key_views.
             super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::iterator
            ((iterator *)ppaVar1,
             (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)&verifier);
  local_19[0] = false;
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            ((iterator *)ppaVar1,(art_key_type)0x0,local_19,true);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  e.keybuf_.off._0_1_ =
       e.stack_.c.
       super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_node ==
       (_Map_pointer)
       e.stack_.c.
       super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
       ._M_impl.super__Deque_impl_data._M_map_size;
  if (!(bool)(byte)e.keybuf_.off) {
    testing::Message::Message((Message *)&local_30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_.message_,(internal *)&e.keybuf_.off,
               (AssertionResult *)"e.valid()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x128,(char *)gtest_ar_.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    std::__cxx11::string::~string((string *)&gtest_ar_.message_);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  e.keybuf_.off._0_1_ = local_19[0] ^ 1;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (local_19[0] != false) {
    testing::Message::Message((Message *)&local_30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_.message_,(internal *)&e.keybuf_.off,(AssertionResult *)0x1e67bb,
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x129,(char *)gtest_ar_.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    std::__cxx11::string::~string((string *)&gtest_ar_.message_);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::~iterator
            ((iterator *)
             &verifier.key_views.
              super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ppaVar1 = &verifier.key_views.
             super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::iterator
            ((iterator *)ppaVar1,
             (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)&verifier);
  local_19[0] = false;
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            ((iterator *)ppaVar1,(art_key_type)0x0,local_19,false);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  e.keybuf_.off._0_1_ =
       e.stack_.c.
       super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_node ==
       (_Map_pointer)
       e.stack_.c.
       super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
       ._M_impl.super__Deque_impl_data._M_map_size;
  if (!(bool)(byte)e.keybuf_.off) {
    testing::Message::Message((Message *)&local_30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_.message_,(internal *)&e.keybuf_.off,
               (AssertionResult *)"e.valid()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x130,(char *)gtest_ar_.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    std::__cxx11::string::~string((string *)&gtest_ar_.message_);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  e.keybuf_.off._0_1_ = local_19[0] ^ 1;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (local_19[0] != false) {
    testing::Message::Message((Message *)&local_30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_.message_,(internal *)&e.keybuf_.off,(AssertionResult *)0x1e67bb,
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x131,(char *)gtest_ar_.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    std::__cxx11::string::~string((string *)&gtest_ar_.message_);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::~iterator
            ((iterator *)
             &verifier.key_views.
              super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::~tree_verifier((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                    *)local_2d0);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTIteratorTest, emptyTreeSeek) {
  using Key = typename TypeParam::key_type;
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  {
    auto e = db.test_only_iterator();
    bool match = false;
    e.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)}, match,
           true /*fwd*/);
    UNODB_EXPECT_FALSE(e.valid());
    UNODB_EXPECT_FALSE(match);
  }
  {
    auto e = db.test_only_iterator();
    bool match = false;
    e.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)}, match,
           false /*fwd*/);
    UNODB_EXPECT_FALSE(e.valid());
    UNODB_EXPECT_FALSE(match);
  }
}